

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> * __thiscall
soul::ResolutionPass::FunctionResolver::findAllPossibleFunctions
          (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
           *__return_storage_ptr__,FunctionResolver *this,CallOrCast *call,QualifiedIdentifier *name
          )

{
  IdentifierPath *this_00;
  PossibleFunction *pPVar1;
  void *pvVar2;
  CommaSeparatedList *pCVar3;
  size_t sVar4;
  pool_ref<soul::AST::Expression> *ppVar5;
  long lVar6;
  undefined8 uVar7;
  Structure *pSVar8;
  Function *f;
  long lVar9;
  long lVar10;
  ArrayView<soul::Type> argTypes_00;
  ArrayView<soul::pool_ptr<soul::AST::Constant>_> constantArgValues;
  ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> constantArgs;
  TypeArray argTypes;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_230;
  PossibleFunction local_1d8;
  undefined1 local_1c8 [88];
  ArrayWithPreallocation<soul::Identifier,_8UL> local_170;
  bool local_118;
  int local_114;
  undefined2 uStack_110;
  bool bStack_10e;
  bool bStack_10d;
  bool bStack_10c;
  undefined2 uStack_10b;
  bool local_109;
  TypeArray local_108;
  
  local_1c8._0_8_ = (call->super_CallOrCastBase).arguments.object;
  AST::CommaSeparatedList::getListOfResultTypes
            (&local_108,(pool_ptr<soul::AST::Expression> *)local_1c8);
  local_1c8._0_8_ = local_1c8 + 0x18;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 8;
  local_170.items = (Identifier *)local_170.space;
  local_170.numActive = 0;
  local_170.numAllocated = 8;
  local_118 = false;
  local_114 = -1;
  uStack_110._0_1_ = true;
  uStack_110._1_1_ = true;
  bStack_10e = true;
  bStack_10d = true;
  bStack_10c = true;
  uStack_10b._0_1_ = false;
  uStack_10b._1_1_ = true;
  local_109 = false;
  this_00 = &name->pathPrefix;
  IdentifierPath::operator+
            ((IdentifierPath *)&local_230,this_00,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_170,&local_230);
  local_230.numActive = 0;
  if ((8 < local_230.numAllocated) && (local_230.items != (Identifier *)0x0)) {
    operator_delete__(local_230.items);
  }
  local_118 = false;
  local_114 = (int)local_108.numActive;
  uStack_110._0_1_ = false;
  uStack_110._1_1_ = false;
  bStack_10e = true;
  bStack_10d = false;
  bStack_10c = false;
  uStack_10b._0_1_ = false;
  uStack_10b._1_1_ = false;
  AST::Scope::performFullNameSearch
            ((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
             parentScope,(NameSearch *)local_1c8,(Statement *)0x0);
  IdentifierPath::operator+
            ((IdentifierPath *)&local_230,this_00,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  sVar4 = local_230.numActive;
  local_230.numActive = 0;
  if ((8 < local_230.numAllocated) && (local_230.items != (Identifier *)0x0)) {
    operator_delete__(local_230.items);
  }
  if (sVar4 == 1) {
    if (local_170.numActive == 0) {
      throwInternalCompilerError("! empty()","back",0xaa);
    }
    IdentifierPath::withSuffix
              ((IdentifierPath *)&local_230,
               &((this->super_ErrorIgnoringRewritingASTVisitor).owner)->intrinsicsNamespacePath,
               local_170.items[local_170.numActive - 1].name);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_170,&local_230);
    local_230.numActive = 0;
    if ((8 < local_230.numAllocated) && (local_230.items != (Identifier *)0x0)) {
      operator_delete__(local_230.items);
    }
    AST::Scope::performFullNameSearch
              ((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context
               .parentScope,(NameSearch *)local_1c8,(Statement *)0x0);
    if ((call->super_CallOrCastBase).isMethodCall == true) {
      if (CONCAT44(local_108.numActive._4_4_,(int)local_108.numActive) == 0) {
        throwInternalCompilerError("argTypes.size() != 0","findAllPossibleFunctions",0x99f);
      }
      if ((local_108.items)->category == structure) {
        pSVar8 = Type::getStructRef(local_108.items);
        pvVar2 = pSVar8->backlinkToASTObject;
        if (pvVar2 != (void *)0x0) {
          IdentifierPath::operator+
                    ((IdentifierPath *)&local_230,this_00,
                     &((name->pathSections).
                       super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                       ._M_impl.super__Vector_impl_data._M_start)->path);
          ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_170,&local_230);
          local_230.numActive = 0;
          if ((8 < local_230.numAllocated) && (local_230.items != (Identifier *)0x0)) {
            operator_delete__(local_230.items);
          }
          AST::Scope::performFullNameSearch
                    (*(Scope **)((long)pvVar2 + 0x20),(NameSearch *)local_1c8,(Statement *)0x0);
        }
      }
    }
  }
  local_230.items = (Identifier *)local_230.space;
  local_230.numActive = 0;
  local_230.numAllocated = 4;
  if ((call->super_CallOrCastBase).arguments.object == (CommaSeparatedList *)0x0) {
    ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::resize
              ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&local_230,
               CONCAT44(local_108.numActive._4_4_,(int)local_108.numActive));
  }
  else {
    ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&local_230,
               CONCAT44(local_108.numActive._4_4_,(int)local_108.numActive));
    pCVar3 = (call->super_CallOrCastBase).arguments.object;
    if (pCVar3 == (CommaSeparatedList *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    sVar4 = (pCVar3->items).numActive;
    if (sVar4 != 0) {
      ppVar5 = (pCVar3->items).items;
      lVar9 = 0;
      do {
        (**(code **)(**(long **)((long)&ppVar5->object + lVar9) + 0x68))(&local_1d8);
        ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::reserve
                  ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&local_230,
                   local_230.numActive + 1);
        local_230.items[local_230.numActive] = (Identifier)local_1d8.function;
        local_230.numActive = local_230.numActive + 1;
        lVar9 = lVar9 + 8;
      } while (sVar4 << 3 != lVar9);
    }
  }
  uVar7 = local_1c8._0_8_;
  __return_storage_ptr__->items = (PossibleFunction *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 4;
  if (local_1c8._8_8_ != 0) {
    lVar10 = local_1c8._8_8_ << 3;
    lVar9 = 0;
    do {
      lVar6 = *(long *)((long)&(((Statement *)uVar7)->super_ASTObject)._vptr_ASTObject + lVar9);
      if (((lVar6 != 0) &&
          (f = (Function *)
               __dynamic_cast(lVar6,&AST::ASTObject::typeinfo,&AST::Function::typeinfo,0),
          f != (Function *)0x0)) && ((f->originalGenericFunction).object == (Function *)0x0)) {
        argTypes_00.e =
             local_108.items + CONCAT44(local_108.numActive._4_4_,(int)local_108.numActive);
        argTypes_00.s = local_108.items;
        constantArgValues.e =
             (pool_ptr<soul::AST::Constant> *)(local_230.items + local_230.numActive);
        constantArgValues.s = (pool_ptr<soul::AST::Constant> *)local_230.items;
        PossibleFunction::PossibleFunction(&local_1d8,f,argTypes_00,constantArgValues);
        ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::
        reserve(__return_storage_ptr__,__return_storage_ptr__->numActive + 1);
        pPVar1 = __return_storage_ptr__->items + __return_storage_ptr__->numActive;
        pPVar1->function = local_1d8.function;
        pPVar1->isImpossible = local_1d8.isImpossible;
        pPVar1->requiresCast = local_1d8.requiresCast;
        pPVar1->requiresGeneric = local_1d8.requiresGeneric;
        pPVar1->functionIsNotResolved = local_1d8.functionIsNotResolved;
        *(undefined4 *)&pPVar1->field_0xc = local_1d8._12_4_;
        __return_storage_ptr__->numActive = __return_storage_ptr__->numActive + 1;
      }
      lVar9 = lVar9 + 8;
    } while (lVar10 != lVar9);
  }
  local_230.numActive = 0;
  if ((4 < local_230.numAllocated) && (local_230.items != (Identifier *)0x0)) {
    operator_delete__(local_230.items);
  }
  local_170.numActive = 0;
  if (8 < local_170.numAllocated) {
    if (local_170.items != (Identifier *)0x0) {
      operator_delete__(local_170.items);
    }
    local_170.items = (Identifier *)local_170.space;
    local_170.numAllocated = 8;
  }
  local_1c8._8_8_ = 0;
  if ((8 < (ulong)local_1c8._16_8_) && ((Expression *)local_1c8._0_8_ != (Expression *)0x0)) {
    operator_delete__((void *)local_1c8._0_8_);
  }
  ArrayWithPreallocation<soul::Type,_8UL>::clear(&local_108);
  return __return_storage_ptr__;
}

Assistant:

ArrayWithPreallocation<PossibleFunction, 4> findAllPossibleFunctions (const AST::CallOrCast& call,
                                                                              const AST::QualifiedIdentifier& name)
        {
            auto argTypes = call.getArgumentTypes();

            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = name.getPath();
            search.stopAtFirstScopeWithResults = false;
            search.requiredNumFunctionArgs = (int) argTypes.size();
            search.findVariables = false;
            search.findTypes = false;
            search.findFunctions = true;
            search.findNamespaces = false;
            search.findProcessors = false;
            search.findProcessorInstances = false;
            search.findEndpoints = false;

            call.getParentScope()->performFullNameSearch (search, nullptr);

            if (name.getPath().isUnqualified())
            {
                // Handle intrinsics with no explicit namespace
                search.partiallyQualifiedPath = owner.intrinsicsNamespacePath.withSuffix (search.partiallyQualifiedPath.getLastPart());
                call.getParentScope()->performFullNameSearch (search, nullptr);

                // Handle "Koenig" lookup for method calls
                if (call.isMethodCall)
                {
                    SOUL_ASSERT (argTypes.size() != 0);

                    if (argTypes.front().isStruct())
                    {
                        if (auto ownerASTObject = argTypes.front().getStructRef().backlinkToASTObject)
                        {
                            auto structDecl = reinterpret_cast<AST::StructDeclaration*> (ownerASTObject);

                            search.partiallyQualifiedPath = name.getPath();
                            structDecl->context.parentScope->performFullNameSearch (search, nullptr);
                        }
                    }
                }
            }

            ArrayWithPreallocation<pool_ptr<AST::Constant>, 4> constantArgs;

            if (call.arguments != nullptr)
            {
                constantArgs.reserve (argTypes.size());

                for (auto& c : call.arguments->items)
                    constantArgs.push_back (c->getAsConstant());
            }
            else
            {
                constantArgs.resize (argTypes.size());
            }

            ArrayWithPreallocation<PossibleFunction, 4> results;

            for (auto& i : search.itemsFound)
                if (auto f = cast<AST::Function> (i))
                    if (f->originalGenericFunction == nullptr)
                        results.push_back (PossibleFunction (*f, argTypes, constantArgs));

            return results;
        }